

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidatePositionAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  bool bVar3;
  int iVar4;
  spv_result_t sVar5;
  spv_const_context psVar6;
  DiagnosticStream *pDVar7;
  map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
  *this_00;
  reference pEVar8;
  mapped_type *pmVar9;
  BuiltInsValidator *local_bf8;
  code *local_bf0;
  undefined8 local_be8;
  type local_be0;
  value_type local_a90;
  uint32_t local_a6c;
  string local_a68;
  string local_a48;
  DiagnosticStream local_a28;
  anon_class_16_2_33bb3f30 local_850;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_840;
  undefined4 local_81c;
  undefined1 auStack_818 [4];
  spv_result_t error_2;
  Instruction *local_810;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_808;
  undefined4 local_7e4;
  undefined1 auStack_7e0 [4];
  spv_result_t error_1;
  Instruction *local_7d8;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_7d0;
  undefined4 local_7b0;
  ExecutionModel local_7ac;
  spv_result_t error;
  ExecutionModel execution_model;
  iterator __end3;
  iterator __begin3;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *__range3;
  BuiltInsValidator *local_788;
  code *local_780;
  undefined8 local_778;
  type local_770;
  value_type local_608;
  uint32_t local_5e4;
  ExecutionModel local_5e0 [2];
  BuiltInsValidator *local_5d8;
  code *local_5d0;
  undefined8 local_5c8;
  type local_5c0;
  function<spv_result_t_(const_spvtools::val::Instruction_&)> local_458;
  uint32_t local_434;
  ExecutionModel local_430 [2];
  BuiltInsValidator *local_428;
  code *local_420;
  undefined8 local_418;
  type local_410;
  function<spv_result_t_(const_spvtools::val::Instruction_&)> local_2a8;
  uint32_t local_284;
  string local_280;
  string local_260;
  string local_240;
  DiagnosticStream local_220;
  StorageClass local_44;
  Instruction *pIStack_40;
  StorageClass storage_class;
  Instruction *referenced_from_inst_local;
  Instruction *referenced_inst_local;
  Instruction *built_in_inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  pIStack_40 = referenced_from_inst;
  referenced_from_inst_local = referenced_inst;
  referenced_inst_local = built_in_inst;
  built_in_inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar6 = ValidationState_t::context(this->_);
  bVar3 = spvIsVulkanEnv(psVar6->target_env);
  if (bVar3) {
    local_44 = GetStorageClass(pIStack_40);
    if (((local_44 != Max) && (local_44 != Input)) && (local_44 != Output)) {
      ValidationState_t::diag(&local_220,this->_,SPV_ERROR_INVALID_DATA,pIStack_40);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_240,this->_,0x10e0,(char *)0x0);
      pDVar7 = DiagnosticStream::operator<<(&local_220,&local_240);
      pDVar7 = DiagnosticStream::operator<<
                         (pDVar7,(char (*) [103])
                                 "Vulkan spec allows BuiltIn Position to be only used for variables with Input or Output storage class. "
                         );
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_260,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                 referenced_from_inst_local,pIStack_40,Max);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_260);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [2])0x634f49);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                (&local_280,this,pIStack_40);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_280);
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_240);
      DiagnosticStream::~DiagnosticStream(&local_220);
      return this_local._4_4_;
    }
    if (local_44 == Input) {
      if (this->function_id_ != 0) {
        __assert_fail("function_id_ == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp"
                      ,0x7e0,
                      "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidatePositionAtReference(const Decoration &, const Instruction &, const Instruction &, const Instruction &)"
                     );
      }
      this_00 = &this->id_to_at_reference_checks_;
      local_284 = Instruction::id(pIStack_40);
      pmVar9 = std::
               map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
               ::operator[](this_00,&local_284);
      local_420 = ValidateNotCalledWithExecutionModel;
      local_418 = 0;
      local_430[1] = 0x10df;
      local_430[0] = Vertex;
      local_428 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const(&)[123],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_410,(offset_in_BuiltInsValidator_to_subr *)&local_420,&local_428,
                 (int *)(local_430 + 1),
                 (char (*) [123])
                 "Vulkan spec doesn\'t allow BuiltIn Position to be used for variables with Input storage class if execution model is Vertex."
                 ,local_430,(Decoration *)built_in_inst_local,referenced_inst_local,pIStack_40,
                 (_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_2a8,&local_410)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar9,&local_2a8);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_2a8);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_410);
      local_434 = Instruction::id(pIStack_40);
      pmVar9 = std::
               map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
               ::operator[](this_00,&local_434);
      local_5d0 = ValidateNotCalledWithExecutionModel;
      local_5c8 = 0;
      local_5e0[1] = 0x10df;
      local_5e0[0] = MeshNV;
      local_5d8 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const(&)[123],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_5c0,(offset_in_BuiltInsValidator_to_subr *)&local_5d0,&local_5d8,
                 (int *)(local_5e0 + 1),
                 (char (*) [123])
                 "Vulkan spec doesn\'t allow BuiltIn Position to be used for variables with Input storage class if execution model is MeshNV."
                 ,local_5e0,(Decoration *)built_in_inst_local,referenced_inst_local,pIStack_40,
                 (_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_458,&local_5c0)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar9,&local_458);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_458);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_5c0);
      local_5e4 = Instruction::id(pIStack_40);
      pmVar9 = std::
               map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
               ::operator[](this_00,&local_5e4);
      local_780 = ValidateNotCalledWithExecutionModel;
      local_778 = 0;
      __range3._4_4_ = 0x10df;
      __range3._0_4_ = 0x14f5;
      local_788 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const(&)[124],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_770,(offset_in_BuiltInsValidator_to_subr *)&local_780,&local_788,
                 (int *)((long)&__range3 + 4),
                 (char (*) [124])
                 "Vulkan spec doesn\'t allow BuiltIn Position to be used for variables with Input storage class if execution model is MeshEXT."
                 ,(ExecutionModel *)&__range3,(Decoration *)built_in_inst_local,
                 referenced_inst_local,pIStack_40,(_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_608,&local_770)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar9,&local_608);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_608);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_770);
    }
    __end3 = std::
             set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             ::begin(&this->execution_models_);
    _error = std::
             set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             ::end(&this->execution_models_);
    while (bVar3 = std::operator!=(&__end3,(_Self *)&error), bVar3) {
      pEVar8 = std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator*(&__end3);
      pIVar2 = built_in_inst_local;
      pIVar1 = referenced_inst_local;
      local_7ac = *pEVar8;
      if (local_7ac == Vertex) {
        local_7d8 = pIStack_40;
        _auStack_7e0 = this;
        std::function<spv_result_t(std::__cxx11::string_const&)>::
        function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidatePositionAtReference(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)::__0,void>
                  ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_7d0,
                   (anon_class_16_2_33bb3f30 *)auStack_7e0);
        sVar5 = ValidateF32Vec(this,(Decoration *)pIVar2,pIVar1,4,&local_7d0);
        std::
        function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::~function(&local_7d0);
        if (sVar5 != SPV_SUCCESS) {
          return sVar5;
        }
        local_7b0 = 0;
      }
      else {
        if (((2 < local_7ac - TessellationControl) && (local_7ac != MeshNV)) &&
           (local_7ac != MeshEXT)) {
          ValidationState_t::diag(&local_a28,this->_,SPV_ERROR_INVALID_DATA,pIStack_40);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_a48,this->_,0x10de,(char *)0x0);
          pDVar7 = DiagnosticStream::operator<<(&local_a28,&local_a48);
          pDVar7 = DiagnosticStream::operator<<
                             (pDVar7,(char (*) [140])
                                     "Vulkan spec allows BuiltIn Position to be used only with Vertex, TessellationControl, TessellationEvaluation or Geometry execution models. "
                             );
          (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                    (&local_a68,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                     referenced_from_inst_local,pIStack_40,local_7ac);
          pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_a68);
          this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
          std::__cxx11::string::~string((string *)&local_a68);
          std::__cxx11::string::~string((string *)&local_a48);
          DiagnosticStream::~DiagnosticStream(&local_a28);
          return this_local._4_4_;
        }
        iVar4 = Decoration::struct_member_index((Decoration *)built_in_inst_local);
        pIVar2 = built_in_inst_local;
        pIVar1 = referenced_inst_local;
        if (iVar4 == -1) {
          local_850.referenced_from_inst = pIStack_40;
          local_850.this = this;
          std::function<spv_result_t(std::__cxx11::string_const&)>::
          function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidatePositionAtReference(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)::__2,void>
                    ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_840,&local_850);
          sVar5 = ValidateOptionalArrayedF32Vec(this,(Decoration *)pIVar2,pIVar1,4,&local_840);
          std::
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function(&local_840);
          if (sVar5 != SPV_SUCCESS) {
            return sVar5;
          }
          local_81c = 0;
        }
        else {
          local_810 = pIStack_40;
          _auStack_818 = this;
          std::function<spv_result_t(std::__cxx11::string_const&)>::
          function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidatePositionAtReference(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)::__1,void>
                    ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_808,
                     (anon_class_16_2_33bb3f30 *)auStack_818);
          sVar5 = ValidateF32Vec(this,(Decoration *)pIVar2,pIVar1,4,&local_808);
          std::
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function(&local_808);
          if (sVar5 != SPV_SUCCESS) {
            return sVar5;
          }
          local_7e4 = 0;
        }
      }
      std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator++(&__end3);
    }
  }
  if (this->function_id_ == 0) {
    local_a6c = Instruction::id(pIStack_40);
    pmVar9 = std::
             map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
             ::operator[](&this->id_to_at_reference_checks_,&local_a6c);
    local_bf0 = ValidatePositionAtReference;
    local_be8 = 0;
    local_bf8 = this;
    std::
    bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
              (&local_be0,(offset_in_BuiltInsValidator_to_subr *)&local_bf0,&local_bf8,
               (Decoration *)built_in_inst_local,referenced_inst_local,pIStack_40,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_a90,&local_be0);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(pmVar9,&local_a90);
    std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_a90);
    std::
    _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
    ::~_Bind(&local_be0);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidatePositionAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input &&
        storage_class != spv::StorageClass::Output) {
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(4320) << "Vulkan spec allows BuiltIn Position to be only used for "
                "variables with Input or Output storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    if (storage_class == spv::StorageClass::Input) {
      assert(function_id_ == 0);
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4319,
          "Vulkan spec doesn't allow BuiltIn Position to be used "
          "for variables "
          "with Input storage class if execution model is Vertex.",
          spv::ExecutionModel::Vertex, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4319,
          "Vulkan spec doesn't allow BuiltIn Position to be used "
          "for variables "
          "with Input storage class if execution model is MeshNV.",
          spv::ExecutionModel::MeshNV, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4319,
          "Vulkan spec doesn't allow BuiltIn Position to be used "
          "for variables "
          "with Input storage class if execution model is MeshEXT.",
          spv::ExecutionModel::MeshEXT, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      switch (execution_model) {
        case spv::ExecutionModel::Vertex: {
          if (spv_result_t error = ValidateF32Vec(
                  decoration, built_in_inst, 4,
                  [this, &referenced_from_inst](
                      const std::string& message) -> spv_result_t {
                    return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
                           << _.VkErrorID(4321)
                           << "According to the Vulkan spec BuiltIn Position "
                              "variable needs to be a 4-component 32-bit float "
                              "vector. "
                           << message;
                  })) {
            return error;
          }
          break;
        }
        case spv::ExecutionModel::Geometry:
        case spv::ExecutionModel::TessellationControl:
        case spv::ExecutionModel::TessellationEvaluation:
        case spv::ExecutionModel::MeshNV:
        case spv::ExecutionModel::MeshEXT: {
          // Position can be a per-vertex variable for tessellation control,
          // tessellation evaluation, geometry and mesh shader stages. In such
          // cases variables will have an array of 4-component 32-bit float
          // vectors.
          if (decoration.struct_member_index() != Decoration::kInvalidMember) {
            // The array is on the variable, so this must be a 4-component
            // 32-bit float vector.
            if (spv_result_t error = ValidateF32Vec(
                    decoration, built_in_inst, 4,
                    [this, &referenced_from_inst](
                        const std::string& message) -> spv_result_t {
                      return _.diag(SPV_ERROR_INVALID_DATA,
                                    &referenced_from_inst)
                             << _.VkErrorID(4321)
                             << "According to the Vulkan spec BuiltIn Position "
                                "variable needs to be a 4-component 32-bit "
                                "float vector. "
                             << message;
                    })) {
              return error;
            }
          } else {
            if (spv_result_t error = ValidateOptionalArrayedF32Vec(
                    decoration, built_in_inst, 4,
                    [this, &referenced_from_inst](
                        const std::string& message) -> spv_result_t {
                      return _.diag(SPV_ERROR_INVALID_DATA,
                                    &referenced_from_inst)
                             << _.VkErrorID(4321)
                             << "According to the Vulkan spec BuiltIn Position "
                                "variable needs to be a 4-component 32-bit "
                                "float vector. "
                             << message;
                    })) {
              return error;
            }
          }
          break;
        }

        default: {
          return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
                 << _.VkErrorID(4318)
                 << "Vulkan spec allows BuiltIn Position to be used only "
                    "with Vertex, TessellationControl, TessellationEvaluation"
                    " or Geometry execution models. "
                 << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                     referenced_from_inst, execution_model);
        }
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidatePositionAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}